

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall QL_Manager::SetUpOneRelation(QL_Manager *this,char *relName)

{
  RelCatEntry *pRVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined3 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  RC RVar10;
  RelCatEntry *rEntry;
  string relString;
  RM_Record relRec;
  RelCatEntry *local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  string local_50 [32];
  RM_Record local_30;
  
  RM_Record::RM_Record(&local_30);
  RVar10 = SM_Manager::GetRelEntry(this->smm,relName,&local_30,&local_80);
  if (RVar10 == 0) {
    pRVar1 = this->relEntries;
    uVar6 = *(undefined3 *)&local_80->field_0x31;
    pRVar1->statsInitialized = local_80->statsInitialized;
    *(undefined3 *)&pRVar1->field_0x31 = uVar6;
    uVar2 = *(undefined8 *)local_80->relName;
    uVar3 = *(undefined8 *)(local_80->relName + 8);
    uVar4 = *(undefined8 *)(local_80->relName + 0x10);
    uVar5 = *(undefined8 *)(local_80->relName + 0x18);
    iVar7 = local_80->indexCount;
    iVar8 = local_80->indexCurrNum;
    iVar9 = local_80->numTuples;
    pRVar1->attrCount = local_80->attrCount;
    pRVar1->indexCount = iVar7;
    pRVar1->indexCurrNum = iVar8;
    pRVar1->numTuples = iVar9;
    *(undefined8 *)(pRVar1->relName + 0x10) = uVar4;
    *(undefined8 *)(pRVar1->relName + 0x18) = uVar5;
    *(undefined8 *)pRVar1->relName = uVar2;
    *(undefined8 *)(pRVar1->relName + 8) = uVar3;
    this->nRels = 1;
    this->nAttrs = local_80->attrCount;
    std::__cxx11::string::string(local_50,relName,(allocator *)&local_78);
    std::__cxx11::string::string((string *)&local_78,local_50);
    local_78.second = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->relToInt,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,local_50);
    local_78.second = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->relToAttrIndex,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string(local_50);
  }
  RM_Record::~RM_Record(&local_30);
  return RVar10;
}

Assistant:

RC QL_Manager::SetUpOneRelation(const char *relName){
  RC rc = 0;
  RelCatEntry *rEntry;
  RM_Record relRec;
  if((rc = smm.GetRelEntry(relName, relRec, rEntry))){
    return (rc);
  }
  memcpy(relEntries, rEntry, sizeof(RelCatEntry));

  nRels = 1;
  nAttrs = rEntry->attrCount;
  string relString(relName);
  relToInt.insert({relString, 0});
  relToAttrIndex.insert({relString, 0});
  return (0);
}